

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema-loader.c++
# Opt level: O3

void __thiscall
capnp::SchemaLoader::Impl::requireStructSize
          (Impl *this,uint64_t id,uint dataWordCount,uint pointerCount)

{
  RemoveConst<kj::HashMap<unsigned_long,_capnp::SchemaLoader::Impl::RequiredSize>::Entry> **ppRVar1;
  ushort uVar2;
  Entry *pEVar3;
  RemoveConst<kj::HashMap<unsigned_long,_capnp::SchemaLoader::Impl::RequiredSize>::Entry> *pRVar4;
  RemoveConst<kj::HashMap<unsigned_long,_capnp::SchemaLoader::Impl::RequiredSize>::Entry> *pRVar5;
  Maybe<capnp::_::RawSchema_*&> MVar6;
  size_t sVar7;
  ushort uVar8;
  ArrayPtr<kj::HashMap<unsigned_long,_capnp::SchemaLoader::Impl::RequiredSize>::Entry> table;
  uint64_t local_50;
  uint64_t local_48;
  ushort uStack_40;
  ushort uStack_3e;
  undefined4 uStack_3c;
  HashIndex<kj::HashMap<unsigned_long,capnp::SchemaLoader::Impl::RequiredSize>::Callbacks>
  local_38 [8];
  long local_30;
  
  uStack_40 = (ushort)dataWordCount;
  uStack_3e = (ushort)pointerCount;
  pEVar3 = (this->structSizeRequirements).table.rows.builder.ptr;
  sVar7 = (long)(this->structSizeRequirements).table.rows.builder.pos - (long)pEVar3 >> 4;
  table.size_ = (size_t)pEVar3;
  table.ptr = (Entry *)&(this->structSizeRequirements).table.indexes;
  local_50 = id;
  local_48 = id;
  kj::HashIndex<kj::HashMap<unsigned_long,capnp::SchemaLoader::Impl::RequiredSize>::Callbacks>::
  insert<kj::HashMap<unsigned_long,capnp::SchemaLoader::Impl::RequiredSize>::Entry,unsigned_long&>
            (local_38,table,sVar7,(unsigned_long *)sVar7);
  if (local_38[0] ==
      (HashIndex<kj::HashMap<unsigned_long,capnp::SchemaLoader::Impl::RequiredSize>::Callbacks>)0x1)
  {
    pEVar3 = (this->structSizeRequirements).table.rows.builder.ptr;
    uVar2 = pEVar3[local_30].value.dataWordCount;
    uVar8 = uStack_40;
    if (uStack_40 < uVar2) {
      uVar8 = uVar2;
    }
    pEVar3[local_30].value.dataWordCount = uVar8;
    uVar2 = pEVar3[local_30].value.pointerCount;
    uVar8 = uStack_3e;
    if (uStack_3e < uVar2) {
      uVar8 = uVar2;
    }
    pEVar3[local_30].value.pointerCount = uVar8;
  }
  else {
    pRVar5 = (this->structSizeRequirements).table.rows.builder.pos;
    if (pRVar5 == (this->structSizeRequirements).table.rows.builder.endPtr) {
      pRVar4 = (this->structSizeRequirements).table.rows.builder.ptr;
      sVar7 = 4;
      if (pRVar5 != pRVar4) {
        sVar7 = (long)pRVar5 - (long)pRVar4 >> 3;
      }
      kj::Vector<kj::HashMap<unsigned_long,_capnp::SchemaLoader::Impl::RequiredSize>::Entry>::
      setCapacity((Vector<kj::HashMap<unsigned_long,_capnp::SchemaLoader::Impl::RequiredSize>::Entry>
                   *)&this->structSizeRequirements,sVar7);
      pRVar5 = (this->structSizeRequirements).table.rows.builder.pos;
    }
    pRVar5->key = local_48;
    *(ulong *)&pRVar5->value = CONCAT44(uStack_3c,CONCAT22(uStack_3e,uStack_40));
    ppRVar1 = &(this->structSizeRequirements).table.rows.builder.pos;
    *ppRVar1 = *ppRVar1 + 1;
  }
  MVar6 = kj::HashMap<unsigned_long,capnp::_::RawSchema*>::find<unsigned_long&>
                    ((HashMap<unsigned_long,capnp::_::RawSchema*> *)&this->schemas,&local_50);
  if (MVar6.ptr != (RawSchema **)0x0) {
    applyStructSizeRequirement(this,*MVar6.ptr,dataWordCount,pointerCount);
  }
  return;
}

Assistant:

void SchemaLoader::Impl::requireStructSize(uint64_t id, uint dataWordCount, uint pointerCount) {
  structSizeRequirements.upsert(id, { uint16_t(dataWordCount), uint16_t(pointerCount) },
      [&](RequiredSize& existingValue, RequiredSize&& newValue) {
    existingValue.dataWordCount = kj::max(existingValue.dataWordCount, newValue.dataWordCount);
    existingValue.pointerCount = kj::max(existingValue.pointerCount, newValue.pointerCount);
  });

  KJ_IF_MAYBE(schema, schemas.find(id)) {
    applyStructSizeRequirement(*schema, dataWordCount, pointerCount);
  }
}